

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O3

void __thiscall SpeciesTracker::Add(SpeciesTracker *this,string *promoter_name,Ptr *polymer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>_>_>_>
  *this_00;
  const_iterator cVar1;
  mapped_type *pmVar2;
  initializer_list<std::shared_ptr<Polymer>_> __l;
  allocator_type local_69;
  shared_ptr<Polymer> local_68;
  vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_> local_58;
  vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_> local_38;
  
  this_00 = &this->promoter_map_;
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>_>_>_>
          ::find(&this_00->_M_t,promoter_name);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->promoter_map_)._M_t._M_impl.super__Rb_tree_header)
  {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>_>_>_>
             ::operator[](this_00,promoter_name);
    std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>::push_back
              (pmVar2,polymer);
    return;
  }
  local_68.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (polymer->super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_68.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (polymer->super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_68.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_68.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_68.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_68.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_68.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  __l._M_len = 1;
  __l._M_array = &local_68;
  std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>::vector
            (&local_58,__l,&local_69);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>_>_>_>
           ::operator[](this_00,promoter_name);
  local_38.super__Vector_base<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pmVar2->
       super__Vector_base<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>).
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_38.super__Vector_base<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pmVar2->
       super__Vector_base<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  local_38.super__Vector_base<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pmVar2->
       super__Vector_base<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  (pmVar2->super__Vector_base<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>)
  ._M_impl.super__Vector_impl_data._M_start =
       local_58.
       super__Vector_base<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (pmVar2->super__Vector_base<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>)
  ._M_impl.super__Vector_impl_data._M_finish =
       local_58.
       super__Vector_base<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (pmVar2->super__Vector_base<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>)
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_58.
       super__Vector_base<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58.super__Vector_base<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>::~vector
            (&local_38);
  std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>::~vector
            (&local_58);
  if (local_68.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return;
}

Assistant:

void SpeciesTracker::Add(const std::string &promoter_name,
                         Polymer::Ptr polymer) {
  if (promoter_map_.count(promoter_name) == 0) {
    promoter_map_[promoter_name] = Polymer::VecPtr{polymer};
  } else {
    promoter_map_[promoter_name].push_back(polymer);
  }
}